

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

int xercesc_4_0::XMLUri::scanHexSequence(XMLCh *addr,XMLSize_t index,XMLSize_t end,int *counter)

{
  XMLCh theChar;
  int iVar1;
  bool bVar2;
  int iVar3;
  int local_4c;
  int local_48;
  int back;
  XMLSize_t start;
  int numDigits;
  XMLCh testChar;
  int *counter_local;
  XMLSize_t end_local;
  XMLSize_t index_local;
  XMLCh *addr_local;
  
  start._0_4_ = 0;
  end_local = index;
  do {
    if (end <= end_local) {
      if (((int)start < 1) || (iVar3 = *counter, *counter = iVar3 + 1, 8 < iVar3 + 1)) {
        local_4c = -1;
      }
      else {
        local_4c = (int)end;
      }
      return local_4c;
    }
    theChar = addr[end_local];
    iVar3 = (int)end_local;
    if (theChar == L':') {
      if ((0 < (int)start) && (iVar1 = *counter, *counter = iVar1 + 1, 8 < iVar1 + 1)) {
        return -1;
      }
      if ((int)start == 0) {
        return iVar3;
      }
      if ((end_local + 1 < end) && (addr[end_local + 1] == L':')) {
        return iVar3;
      }
      start._0_4_ = 0;
    }
    else {
      bVar2 = XMLString::isHex(theChar);
      if (!bVar2) {
        if ((((theChar == L'.') && ((int)start < 4)) && (0 < (int)start)) && (*counter < 7)) {
          iVar3 = (iVar3 - (int)start) + -1;
          local_48 = (int)index;
          if (local_48 <= iVar3) {
            local_48 = iVar3;
          }
          return local_48;
        }
        return -1;
      }
      start._0_4_ = (int)start + 1;
      if (4 < (int)start) {
        return -1;
      }
    }
    end_local = end_local + 1;
  } while( true );
}

Assistant:

int XMLUri::scanHexSequence (const XMLCh* const addr, XMLSize_t index, XMLSize_t end, int& counter)
{
    XMLCh testChar = chNull;
    int numDigits = 0;
    XMLSize_t start = index;

    // Trying to match the following productions:
    // hexseq = hex4 *( ":" hex4)
    // hex4   = 1*4HEXDIG
    for (; index < end; ++index)
    {
      	testChar = addr[index];
      	if (testChar == chColon)
      	{
      	    // IPv6 addresses are 128-bit, so there can be at most eight sections.
      	    if (numDigits > 0 && ++counter > 8)
      	    {
      	        return -1;
      	    }
      	    // This could be '::'.
      	    if (numDigits == 0 || ((index+1 < end) && addr[index+1] == chColon))
      	    {
      	        return (int)index;
      	    }
      	    numDigits = 0;
        }
        // This might be invalid or an IPv4address. If it's potentially an IPv4address,
        // backup to just after the last valid character that matches hexseq.
        else if (!XMLString::isHex(testChar))
        {
            if (testChar == chPeriod && numDigits < 4 && numDigits > 0 && counter <= 6)
            {
                int back = (int)index - numDigits - 1;
                return (back >= (int)start) ? back : (int)start;
            }
            return -1;
        }
        // There can be at most 4 hex digits per group.
        else if (++numDigits > 4)
        {
            return -1;
        }
    }
    return (numDigits > 0 && ++counter <= 8) ? (int)end : -1;
}